

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageColorReplace(Image *image,Color color,Color replace)

{
  uint uVar1;
  int iVar2;
  Color *pCVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    pCVar3 = LoadImageColors(*image);
    iVar4 = 0;
    iVar2 = image->height;
    if (image->height < 1) {
      iVar2 = 0;
    }
    for (; iVar4 != iVar2; iVar4 = iVar4 + 1) {
      uVar1 = image->width;
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      lVar6 = (long)(int)(uVar1 * iVar4);
      for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        if (((pCVar3[lVar6 + uVar7].r == color.r) && (pCVar3[lVar6 + uVar7].g == color.g)) &&
           ((pCVar3[lVar6 + uVar7].b == color.b &&
            ((uint)color >> 0x18 == (uint)pCVar3[lVar6 + uVar7].a)))) {
          pCVar3[lVar6 + uVar7].r = replace.r;
          pCVar3[lVar6 + uVar7].g = replace.g;
          pCVar3[lVar6 + uVar7].b = replace.b;
          pCVar3[lVar6 + uVar7].a = replace.a;
        }
      }
    }
    iVar2 = image->format;
    free(image->data);
    image->data = pCVar3;
    image->format = 7;
    ImageFormat(image,iVar2);
    return;
  }
  return;
}

Assistant:

void ImageColorReplace(Image *image, Color color, Color replace)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            if ((pixels[y*image->width + x].r == color.r) &&
                (pixels[y*image->width + x].g == color.g) &&
                (pixels[y*image->width + x].b == color.b) &&
                (pixels[y*image->width + x].a == color.a))
            {
                pixels[y*image->width + x].r = replace.r;
                pixels[y*image->width + x].g = replace.g;
                pixels[y*image->width + x].b = replace.b;
                pixels[y*image->width + x].a = replace.a;
            }
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}